

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O3

void dirDEFDEVICE(void)

{
  int badValue;
  pointer ppCVar1;
  bool bVar2;
  int iVar3;
  char *__s1;
  ulong uVar4;
  CDeviceDef *pCVar5;
  int iVar6;
  long lVar7;
  pointer ppCVar8;
  pointer ppCVar9;
  char *message;
  bool optional [258];
  aint args [258];
  CDeviceDef *local_550;
  bool local_548 [2];
  undefined1 local_546 [270];
  int local_438;
  int local_434;
  int local_430 [256];
  
  __s1 = GetID(&lp);
  ppCVar1 = DefDevices.super__Vector_base<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (__s1 == (char *)0x0) {
    Error("[DEFDEVICE] expected syntax is <deviceid>, <slot_size>, <page_count>[, <slot_0_initial_page>[, ...]]"
          ,bp,SUPPRESS);
    return;
  }
  uVar4 = (long)DefDevices.super__Vector_base<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)DefDevices.super__Vector_base<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>._M_impl.
                super__Vector_impl_data._M_start;
  ppCVar8 = DefDevices.super__Vector_base<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (0 < (long)uVar4 >> 5) {
    ppCVar8 = (pointer)((uVar4 & 0xffffffffffffffe0) +
                       (long)DefDevices.
                             super__Vector_base<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>._M_impl
                             .super__Vector_impl_data._M_start);
    lVar7 = ((long)uVar4 >> 5) + 1;
    ppCVar9 = DefDevices.super__Vector_base<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>._M_impl.
              super__Vector_impl_data._M_start + 2;
    do {
      iVar3 = strcasecmp(__s1,ppCVar9[-2]->ID);
      if (iVar3 == 0) {
        ppCVar9 = ppCVar9 + -2;
        goto LAB_001119c7;
      }
      iVar3 = strcasecmp(__s1,ppCVar9[-1]->ID);
      if (iVar3 == 0) {
        ppCVar9 = ppCVar9 + -1;
        goto LAB_001119c7;
      }
      iVar3 = strcasecmp(__s1,(*ppCVar9)->ID);
      if (iVar3 == 0) goto LAB_001119c7;
      iVar3 = strcasecmp(__s1,ppCVar9[1]->ID);
      if (iVar3 == 0) {
        ppCVar9 = ppCVar9 + 1;
        goto LAB_001119c7;
      }
      lVar7 = lVar7 + -1;
      ppCVar9 = ppCVar9 + 4;
    } while (1 < lVar7);
    uVar4 = (long)ppCVar1 - (long)ppCVar8;
  }
  lVar7 = (long)uVar4 >> 3;
  if (lVar7 != 1) {
    if (lVar7 != 2) {
      ppCVar9 = ppCVar1;
      if ((lVar7 != 3) || (iVar3 = strcasecmp(__s1,(*ppCVar8)->ID), ppCVar9 = ppCVar8, iVar3 == 0))
      goto LAB_001119c7;
      ppCVar8 = ppCVar8 + 1;
    }
    iVar3 = strcasecmp(__s1,(*ppCVar8)->ID);
    ppCVar9 = ppCVar8;
    if (iVar3 == 0) goto LAB_001119c7;
    ppCVar8 = ppCVar8 + 1;
  }
  iVar3 = strcasecmp(__s1,(*ppCVar8)->ID);
  ppCVar9 = ppCVar8;
  if (iVar3 != 0) {
    ppCVar9 = ppCVar1;
  }
LAB_001119c7:
  if (1 < pass || ppCVar9 != ppCVar1) {
    if (pass < 2) {
      Error("[DEFDEVICE] device with such ID is already defined",__s1,EARLY);
    }
    SkipToEol(&lp);
    return;
  }
  memset(&local_438,0,0x408);
  memset(local_548,0,0x102);
  memset(local_430,0xff,0x3f8);
  memset(local_546,1,0xfe);
  bVar2 = anyComma(&lp);
  message = 
  "[DEFDEVICE] expected syntax is <deviceid>, <slot_size>, <page_count>[, <slot_0_initial_page>[, ...]]"
  ;
  if ((bVar2) &&
     (bVar2 = getIntArguments<258>(&lp,(aint (*) [258])&local_438,(bool (*) [258])local_548), bVar2)
     ) {
    if (0 < local_434 && 0xffff00fe < local_438 - 0x10001U) {
      pCVar5 = (CDeviceDef *)operator_new(0x418);
      CDeviceDef::CDeviceDef(pCVar5,__s1,local_438,local_434);
      local_550 = pCVar5;
      std::vector<CDeviceDef*,std::allocator<CDeviceDef*>>::emplace_back<CDeviceDef*>
                ((vector<CDeviceDef*,std::allocator<CDeviceDef*>> *)&DefDevices,&local_550);
      pCVar5 = DefDevices.super__Vector_base<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>._M_impl.
               super__Vector_impl_data._M_finish[-1];
      iVar3 = pCVar5->SlotsCount;
      if (iVar3 < 1) {
        return;
      }
      iVar6 = -1;
      lVar7 = 0;
      do {
        badValue = local_430[lVar7];
        if (badValue < 0) {
          if (badValue != -1) goto LAB_00111b59;
LAB_00111b6a:
          badValue = (uint)(iVar6 < pCVar5->PagesCount + -1) + iVar6;
        }
        else if (pCVar5->PagesCount <= badValue) {
LAB_00111b59:
          ErrorInt("[DEFDEVICE] invalid initial page",badValue,EARLY);
          iVar3 = pCVar5->SlotsCount;
          goto LAB_00111b6a;
        }
        iVar6 = badValue;
        pCVar5->initialPages[lVar7] = iVar6;
        lVar7 = lVar7 + 1;
        if (iVar3 <= lVar7) {
          return;
        }
      } while( true );
    }
    message = "[DEFDEVICE] valid slot_size: 256..64ki, page_count: 1 or more";
  }
  Error(message,bp,EARLY);
  return;
}

Assistant:

static void dirDEFDEVICE() {
	//DEFDEVICE <deviceid>, <slot_size>, <page_count>[, <slot_0_initial_page>[, ...]]
	const char* id = GetID(lp);
	if (!id) {
		Error(DEFDEVICE_SYNTAX_ERR, bp, SUPPRESS);
		return;
	}

	const bool is_defined = std::any_of(
		DefDevices.begin(), DefDevices.end(),
		[&](const CDeviceDef* el) { return 0 == strcasecmp(id, el->getID()); }
	);
	if (is_defined || 1 < pass) {
		// same id defined twice during first pass?
		if (pass <= 1) Error("[DEFDEVICE] device with such ID is already defined", id, EARLY);
		// in later passes ignore the line, DEFDEVICE works only in first pass
		SkipToEol(lp);
		return;
	}

	// add new definition if arguments are correct and this is first pass
	aint args[2 + CDeviceDef::MAX_SLOT_N] = {};	// slot_size, page_count, initial pages, ...
	bool optional[2 + CDeviceDef::MAX_SLOT_N] = {false, false};
	aint &slot_size = args[0], &page_count = args[1], *initial_pages = args + 2;
	for (size_t i = 2; i < CDeviceDef::MAX_SLOT_N; ++i) {
		args[i] = -1;
		optional[i] = true;
	}
	if (!anyComma(lp) || !getIntArguments<2 + CDeviceDef::MAX_SLOT_N>(lp, args, optional)) {
		Error(DEFDEVICE_SYNTAX_ERR, bp, EARLY);
		return;
	}
	if (slot_size < 256 || 0x10000 < slot_size || page_count <= 0) {
		Error("[DEFDEVICE] valid slot_size: 256..64ki, page_count: 1 or more", bp, EARLY);
		return;
	}
	DefDevices.push_back(new CDeviceDef(id, slot_size, page_count));

	// init "initialPages array by going 0, 1, 2, ..., page_count-1, page_count-1, ... or parsed explicit values
	CDeviceDef & dev = *DefDevices.back();
	int previous_page = -1;
	for (int32_t i = 0; i < dev.SlotsCount; ++i) {
		if (0 <= initial_pages[i] && initial_pages[i] < dev.PagesCount) {
			previous_page = initial_pages[i];
		} else {
			if (-1 != initial_pages[i]) ErrorInt("[DEFDEVICE] invalid initial page", initial_pages[i], EARLY);
			if (previous_page < dev.PagesCount - 1) ++previous_page;
		}
		dev.initialPages[i] = previous_page;
	}
}